

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

char * Gia_ManFormulaEndToken(char *pForm)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    bVar1 = *pForm;
    if (bVar1 < 0x29) {
      if (bVar1 == 0x28) {
        iVar2 = iVar2 + 1;
      }
      else if (bVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x280,"char *Gia_ManFormulaEndToken(char *)");
      }
    }
    else if (bVar1 == 0x29) {
      iVar2 = iVar2 + -1;
    }
    else if (bVar1 == 0x7e) {
      __assert_fail("*pThis != \'~\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x278,"char *Gia_ManFormulaEndToken(char *)");
    }
    pForm = (char *)((byte *)pForm + 1);
  } while (iVar2 != 0);
  return (char *)(byte *)pForm;
}

Assistant:

char * Gia_ManFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        assert( *pThis != '~' );
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}